

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

int __thiscall
picojson::
input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::getc(input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *this,FILE *__stream)

{
  char *pcVar1;
  byte *pbVar2;
  
  if (this->consumed_ == true) {
    pcVar1 = (this->cur_)._M_current;
    if (*pcVar1 == '\n') {
      this->line_ = this->line_ + 1;
    }
    (this->cur_)._M_current = pcVar1 + 1;
  }
  pbVar2 = (byte *)(this->cur_)._M_current;
  if (pbVar2 != (byte *)(this->end_)._M_current) {
    this->consumed_ = true;
    return (int)*pbVar2;
  }
  this->consumed_ = false;
  return -1;
}

Assistant:

int getc() {
    if (consumed_) {
      if (*cur_ == '\n') {
        ++line_;
      }
      ++cur_;
    }
    if (cur_ == end_) {
      consumed_ = false;
      return -1;
    }
    consumed_ = true;
    return *cur_ & 0xff;
  }